

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint inflateNoCompression
               (ucvector *out,LodePNGBitReader *reader,LodePNGDecompressSettings *settings)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint error;
  uint NLEN;
  uint LEN;
  size_t size;
  size_t bytepos;
  size_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  long local_28;
  uint local_4;
  
  uVar1 = in_RSI[1];
  local_4 = 0;
  uVar4 = in_RSI[3] + 7U >> 3;
  if (uVar4 + 4 < uVar1) {
    uVar2 = (uint)*(byte *)(*in_RSI + uVar4) + (uint)*(byte *)(*in_RSI + 1 + uVar4) * 0x100;
    local_28 = uVar4 + 4;
    if ((*(int *)(in_RDX + 4) == 0) &&
       (uVar2 + (uint)*(byte *)(*in_RSI + uVar4 + 2) +
                (uint)*(byte *)(*in_RSI + 1 + uVar4 + 2) * 0x100 != 0xffff)) {
      local_4 = 0x15;
    }
    else {
      uVar3 = ucvector_resize((ucvector *)(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                             );
      if (uVar3 == 0) {
        local_4 = 0x53;
      }
      else if (uVar1 < local_28 + (ulong)uVar2) {
        local_4 = 0x17;
      }
      else {
        if (uVar2 != 0) {
          lodepng_memcpy((void *)((*in_RDI + in_RDI[1]) - (ulong)uVar2),(void *)(*in_RSI + local_28)
                         ,(ulong)uVar2);
          local_28 = (ulong)uVar2 + local_28;
        }
        in_RSI[3] = local_28 << 3;
      }
    }
  }
  else {
    local_4 = 0x34;
  }
  return local_4;
}

Assistant:

static unsigned inflateNoCompression(ucvector* out, LodePNGBitReader* reader,
                                     const LodePNGDecompressSettings* settings) {
  size_t bytepos;
  size_t size = reader->size;
  unsigned LEN, NLEN, error = 0;

  /*go to first boundary of byte*/
  bytepos = (reader->bp + 7u) >> 3u;

  /*read LEN (2 bytes) and NLEN (2 bytes)*/
  if(bytepos + 4 >= size) return 52; /*error, bit pointer will jump past memory*/
  LEN = (unsigned)reader->data[bytepos] + ((unsigned)reader->data[bytepos + 1] << 8u); bytepos += 2;
  NLEN = (unsigned)reader->data[bytepos] + ((unsigned)reader->data[bytepos + 1] << 8u); bytepos += 2;

  /*check if 16-bit NLEN is really the one's complement of LEN*/
  if(!settings->ignore_nlen && LEN + NLEN != 65535) {
    return 21; /*error: NLEN is not one's complement of LEN*/
  }

  if(!ucvector_resize(out, out->size + LEN)) return 83; /*alloc fail*/

  /*read the literal data: LEN bytes are now stored in the out buffer*/
  if(bytepos + LEN > size) return 23; /*error: reading outside of in buffer*/

  /*out->data can be NULL (when LEN is zero), and arithmetics on NULL ptr is undefined*/
  if (LEN) {
    lodepng_memcpy(out->data + out->size - LEN, reader->data + bytepos, LEN);
    bytepos += LEN;
  }

  reader->bp = bytepos << 3u;

  return error;
}